

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O1

Expected<Program,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* Program::create(Expected<Program,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *__return_storage_ptr__,string *fragment_src,string *vertex_src)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined8 uVar3;
  size_type sVar4;
  uint uVar5;
  Handle handle;
  Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  vertex_result;
  GLint linked;
  Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  fragment_result;
  GLsizei length;
  char info [2048];
  Handle local_8cc;
  undefined1 local_8c8 [32];
  bool local_8a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a0;
  int local_87c;
  undefined1 local_878 [32];
  bool local_858;
  string local_850;
  undefined4 local_82c;
  _Alloc_hider local_828;
  undefined8 local_820;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_818 [127];
  
  uVar5 = glCreateProgram();
  local_8cc.name_ = uVar5;
  if (uVar5 == 0) {
    local_8c8._0_8_ = local_8c8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_8c8,"Cannot create program","");
  }
  else {
    if ((vertex_src->_M_string_length != 0) && (fragment_src->_M_string_length != 0)) {
      anon_unknown.dwarf_846fc::Shader::create
                ((Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_8c8,0x8b31,vertex_src);
      if (local_8a8 == false) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_878,"Cannot compile vertex shader: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_8c8);
        uVar3 = local_878._8_8_;
        if ((undefined1 *)local_878._0_8_ == local_878 + 0x10) {
          local_818[0]._8_8_ = local_878._24_8_;
          local_828._M_p = (pointer)local_818;
        }
        else {
          local_828._M_p = (pointer)local_878._0_8_;
        }
        local_818[0]._1_7_ = local_878._17_7_;
        local_818[0]._M_local_buf[0] = local_878[0x10];
        local_878._8_8_ = 0;
        local_878[0x10] = '\0';
        paVar1 = &(__return_storage_ptr__->field_0).error_.error_.field_2;
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)&__return_storage_ptr__->field_0 = paVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_828._M_p == local_818) {
          paVar1->_M_allocated_capacity = local_818[0]._M_allocated_capacity;
          *(undefined8 *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) =
               local_818[0]._8_8_;
        }
        else {
          (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p = local_828._M_p;
          (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
               local_818[0]._M_allocated_capacity;
        }
        (__return_storage_ptr__->field_0).error_.error_._M_string_length = uVar3;
        local_820 = 0;
        local_818[0]._M_allocated_capacity = (ulong)(uint7)local_878._17_7_ << 8;
        __return_storage_ptr__->has_value_ = false;
        local_878._0_8_ = local_878 + 0x10;
        local_828._M_p = (pointer)local_818;
      }
      else {
        anon_unknown.dwarf_846fc::Shader::create
                  ((Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_878,0x8b30,fragment_src);
        if (local_858 == false) {
          std::operator+(&local_8a0,"Cannot compile fragment shader: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_878);
          local_818[0]._M_allocated_capacity = local_8a0.field_2._M_allocated_capacity;
          sVar4 = local_8a0._M_string_length;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_8a0._M_dataplus._M_p == &local_8a0.field_2) {
            local_818[0]._8_8_ = local_8a0.field_2._8_8_;
            local_828._M_p = (pointer)local_818;
          }
          else {
            local_828._M_p = local_8a0._M_dataplus._M_p;
          }
          local_8a0._M_string_length = 0;
          local_8a0.field_2._M_allocated_capacity =
               local_8a0.field_2._M_allocated_capacity & 0xffffffffffffff00;
          paVar1 = &(__return_storage_ptr__->field_0).error_.error_.field_2;
          *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            **)&__return_storage_ptr__->field_0 = paVar1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_828._M_p == local_818) {
            paVar1->_M_allocated_capacity = local_818[0]._M_allocated_capacity;
            *(undefined8 *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) =
                 local_818[0]._8_8_;
          }
          else {
            (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p = local_828._M_p;
            (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
                 local_818[0]._M_allocated_capacity;
          }
          (__return_storage_ptr__->field_0).error_.error_._M_string_length = sVar4;
          local_820 = 0;
          local_818[0]._M_allocated_capacity =
               local_818[0]._M_allocated_capacity & 0xffffffffffffff00;
          __return_storage_ptr__->has_value_ = false;
          local_8a0._M_dataplus._M_p = (pointer)&local_8a0.field_2;
          local_828._M_p = (pointer)local_818;
        }
        else {
          if (local_8a8 == false) {
            aAppDebugPrintf("[CRASH] Unexpected");
            aAppTerminate(-1);
          }
          glAttachShader(uVar5,local_8c8._0_8_ & 0xffffffff);
          if (local_858 == false) {
            aAppDebugPrintf("[CRASH] Unexpected");
            aAppTerminate(-1);
          }
          glAttachShader(uVar5,local_878._0_8_ & 0xffffffff);
          glLinkProgram(uVar5);
          local_87c = 0;
          glGetProgramiv(uVar5,0x8b82);
          if (local_87c == 1) {
            aAppDebugPrintf("Built program %u",(ulong)uVar5);
            local_8cc.name_ = 0;
            *(uint *)&__return_storage_ptr__->field_0 = uVar5;
            local_828._M_p = local_828._M_p & 0xffffffff00000000;
            __return_storage_ptr__->has_value_ = true;
            Handle::~Handle((Handle *)&local_828);
          }
          else {
            local_82c = 0;
            glGetProgramInfoLog(uVar5,0x800,&local_82c,&local_828);
            format_abi_cxx11_(&local_850,"Program link error: %s",&local_828);
            sVar4 = local_850._M_string_length;
            paVar1 = &local_8a0.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_850._M_dataplus._M_p == &local_850.field_2) {
              local_8a0.field_2._8_8_ = local_850.field_2._8_8_;
              local_8a0._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_8a0._M_dataplus._M_p = local_850._M_dataplus._M_p;
            }
            local_8a0.field_2._M_allocated_capacity._1_7_ =
                 local_850.field_2._M_allocated_capacity._1_7_;
            local_8a0.field_2._M_local_buf[0] = local_850.field_2._M_local_buf[0];
            local_850._M_string_length = 0;
            local_850.field_2._M_local_buf[0] = '\0';
            paVar2 = &(__return_storage_ptr__->field_0).error_.error_.field_2;
            *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)&__return_storage_ptr__->field_0 = paVar2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_8a0._M_dataplus._M_p == paVar1) {
              paVar2->_M_allocated_capacity = local_8a0.field_2._M_allocated_capacity;
              *(undefined8 *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) =
                   local_8a0.field_2._8_8_;
            }
            else {
              (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p =
                   local_8a0._M_dataplus._M_p;
              (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
                   local_8a0.field_2._M_allocated_capacity;
            }
            (__return_storage_ptr__->field_0).error_.error_._M_string_length = sVar4;
            local_8a0._M_string_length = 0;
            local_8a0.field_2._M_allocated_capacity =
                 (ulong)(uint7)local_850.field_2._M_allocated_capacity._1_7_ << 8;
            __return_storage_ptr__->has_value_ = false;
            local_8a0._M_dataplus._M_p = (pointer)paVar1;
            local_850._M_dataplus._M_p = (pointer)&local_850.field_2;
          }
        }
        Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~Expected((Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_878);
      }
      Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~Expected((Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_8c8);
      goto LAB_00126d42;
    }
    local_8c8._0_8_ = local_8c8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_8c8,"Empty shader sources","");
  }
  uVar3 = local_8c8._8_8_;
  if ((undefined1 *)local_8c8._0_8_ == local_8c8 + 0x10) {
    local_818[0]._8_8_ = local_8c8._24_8_;
    local_828._M_p = (pointer)local_818;
  }
  else {
    local_828._M_p = (pointer)local_8c8._0_8_;
  }
  local_818[0]._1_7_ = local_8c8._17_7_;
  local_818[0]._M_local_buf[0] = local_8c8[0x10];
  local_8c8._8_8_ = 0;
  local_8c8[0x10] = '\0';
  paVar1 = &(__return_storage_ptr__->field_0).error_.error_.field_2;
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)&__return_storage_ptr__->field_0 = paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_828._M_p == local_818) {
    paVar1->_M_allocated_capacity = local_818[0]._M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) =
         local_818[0]._8_8_;
  }
  else {
    (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p = local_828._M_p;
    (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
         local_818[0]._M_allocated_capacity;
  }
  (__return_storage_ptr__->field_0).error_.error_._M_string_length = uVar3;
  local_820 = 0;
  local_818[0]._M_allocated_capacity = (ulong)(uint7)local_8c8._17_7_ << 8;
  __return_storage_ptr__->has_value_ = false;
  local_8c8._0_8_ = local_8c8 + 0x10;
  local_828._M_p = (pointer)local_818;
LAB_00126d42:
  Handle::~Handle(&local_8cc);
  return __return_storage_ptr__;
}

Assistant:

Expected<Program,std::string> Program::create(const std::string& fragment_src, const std::string &vertex_src) {
	Handle handle(glCreateProgram());
	if (!handle.name())
		return Unexpected(std::string("Cannot create program"));

	if (vertex_src.empty() || fragment_src.empty())
		return Unexpected(std::string("Empty shader sources"));

	auto vertex_result = Shader::create(GL_VERTEX_SHADER, vertex_src);
	if (!vertex_result.hasValue())
		return Unexpected("Cannot compile vertex shader: " + vertex_result.error());

	auto fragment_result = Shader::create(GL_FRAGMENT_SHADER, fragment_src);
	if (!fragment_result.hasValue())
		return Unexpected("Cannot compile fragment shader: " + fragment_result.error());

	glAttachShader(handle.name(), vertex_result->name());
	glAttachShader(handle.name(), fragment_result->name());

	glLinkProgram(handle.name());

	GLint linked = GL_FALSE;
	glGetProgramiv(handle.name(), GL_LINK_STATUS, &linked);
	if (linked != GL_TRUE) {
		GLsizei length = 0;
		char info[2048];
		glGetProgramInfoLog(handle.name(), COUNTOF(info), &length, info);
		return Unexpected(format("Program link error: %s", info));
	}

	MSG("Built program %u", handle.name());
	return Program(std::move(handle));
}